

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O2

int pmx::ReadIndex(istream *stream,int size)

{
  uint uVar1;
  bool bVar2;
  uint8_t tmp8;
  uint16_t tmp16;
  int tmp32;
  
  if (size == 4) {
    std::istream::read((char *)stream,(long)&tmp32);
  }
  else {
    if (size == 2) {
      std::istream::read((char *)stream,(long)&tmp16);
      uVar1 = (uint)tmp16;
      bVar2 = tmp16 == 0xffff;
    }
    else {
      if (size != 1) {
        return -1;
      }
      std::istream::read((char *)stream,(long)&tmp8);
      uVar1 = (uint)tmp8;
      bVar2 = tmp8 == 0xff;
    }
    tmp32 = 0xffffffff;
    if (!bVar2) {
      tmp32 = uVar1;
    }
  }
  return tmp32;
}

Assistant:

int ReadIndex(std::istream *stream, int size)
	{
		switch (size)
		{
		case 1:
			uint8_t tmp8;
			stream->read((char*) &tmp8, sizeof(uint8_t));
			if (255 == tmp8)
			{
				return -1;
			}
			else {
				return (int) tmp8;
			}
		case 2:
			uint16_t tmp16;
			stream->read((char*) &tmp16, sizeof(uint16_t));
			if (65535 == tmp16)
			{
				return -1;
			}
			else {
				return (int) tmp16;
			}
		case 4:
			int tmp32;
			stream->read((char*) &tmp32, sizeof(int));
			return tmp32;
		default:
			return -1;
		}
	}